

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

uint32 google::protobuf::compiler::cpp::ParseLoopGenerator::ExpectedTag
                 (FieldDescriptor *field,uint32 *fallback_tag_ptr)

{
  int iVar1;
  bool bVar2;
  Type TVar3;
  LogMessage *other;
  WireType WVar4;
  WireType WVar5;
  WireType WVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  bVar2 = FieldDescriptor::is_packable(field);
  if (bVar2) {
    TVar3 = FieldDescriptor::type(field);
    WVar4 = *(WireType *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4);
    iVar1 = *(int *)(field + 0x44);
    WVar5 = iVar1 << 3;
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
                 ,0x6a8);
      other = internal::LogMessage::operator<<
                        (&local_60,
                         "CHECK failed: expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED: "
                        );
      internal::LogFinisher::operator=(&local_61,other);
      internal::LogMessage::~LogMessage(&local_60);
      WVar5 = *(int *)(field + 0x44) << 3;
    }
    WVar4 = iVar1 << 3 | WVar4;
    bVar2 = FieldDescriptor::is_packed(field);
    WVar6 = WVar5 | WIRETYPE_LENGTH_DELIMITED;
    if (bVar2) {
      WVar6 = WVar4;
      WVar4 = WVar5 | WIRETYPE_LENGTH_DELIMITED;
    }
    *fallback_tag_ptr = WVar6;
  }
  else {
    WVar4 = internal::WireFormat::WireTypeForField(field);
    WVar4 = *(int *)(field + 0x44) << 3 | WVar4;
  }
  return WVar4;
}

Assistant:

static uint32 ExpectedTag(const FieldDescriptor* field,
                            uint32* fallback_tag_ptr) {
    uint32 expected_tag;
    if (field->is_packable()) {
      auto expected_wiretype = WireFormat::WireTypeForFieldType(field->type());
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
      GOOGLE_CHECK(expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      auto fallback_wiretype = WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
      uint32 fallback_tag =
          WireFormatLite::MakeTag(field->number(), fallback_wiretype);

      if (field->is_packed()) std::swap(expected_tag, fallback_tag);
      *fallback_tag_ptr = fallback_tag;
    } else {
      auto expected_wiretype = WireFormat::WireTypeForField(field);
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
    }
    return expected_tag;
  }